

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCompressedTexture.cpp
# Opt level: O3

void __thiscall
tcu::anon_unknown_0::decompressEAC_RG11
          (anon_unknown_0 *this,PixelBufferAccess *dst,deUint8 *src,bool signedMode)

{
  int i;
  int iVar1;
  long lVar2;
  int y;
  ulong src_00;
  long lVar3;
  ushort uVar4;
  deUint8 *dst_00;
  ulong src_01;
  deUint8 *dst_01;
  deUint8 uncompressedBlockG [32];
  deUint8 uncompressedBlockR [32];
  deUint8 local_78 [32];
  deUint8 local_58 [40];
  
  lVar2 = 0;
  src_00 = 0;
  do {
    src_00 = (ulong)src[lVar2] | src_00 << 8;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 8);
  lVar2 = 0;
  src_01 = 0;
  do {
    src_01 = (ulong)src[lVar2 + 8] | src_01 << 8;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 8);
  dst_01 = local_58;
  EtcDecompressInternal::decompressEAC11Block(dst_01,src_00,signedMode);
  dst_00 = local_78;
  EtcDecompressInternal::decompressEAC11Block(dst_00,src_01,signedMode);
  iVar1 = 0;
  lVar2 = 0;
  do {
    lVar3 = 0;
    do {
      uVar4 = *(ushort *)(dst_01 + lVar3 * 2);
      if (signedMode) {
        if ((short)uVar4 < 0) {
          uVar4 = -((ushort)((-(uint)uVar4 & 0xffff) >> 6) | uVar4 * -0x20);
        }
        else {
          uVar4 = uVar4 >> 6 | uVar4 << 5;
        }
        *(ushort *)
         ((long)(dst->super_ConstPixelBufferAccess).m_size.m_data + lVar3 * 4 + (long)iVar1 + -8) =
             uVar4;
        uVar4 = *(ushort *)(dst_00 + lVar3 * 2);
        if ((short)uVar4 < 0) {
          uVar4 = -((ushort)((-(uint)uVar4 & 0xffff) >> 6) | uVar4 * -0x20);
        }
        else {
          uVar4 = uVar4 >> 6 | uVar4 << 5;
        }
      }
      else {
        *(ushort *)
         ((long)(dst->super_ConstPixelBufferAccess).m_size.m_data + lVar3 * 4 + (long)iVar1 + -8) =
             uVar4 >> 6 | uVar4 << 5;
        uVar4 = *(ushort *)(dst_00 + lVar3 * 2) >> 6 | *(ushort *)(dst_00 + lVar3 * 2) << 5;
      }
      *(ushort *)
       ((long)(dst->super_ConstPixelBufferAccess).m_size.m_data + lVar3 * 4 + (long)iVar1 + -6) =
           uVar4;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
    lVar2 = lVar2 + 1;
    dst_00 = dst_00 + 8;
    dst_01 = dst_01 + 8;
    iVar1 = iVar1 + (int)this;
  } while (lVar2 != 4);
  return;
}

Assistant:

void decompressEAC_RG11 (const PixelBufferAccess& dst, const deUint8* src, bool signedMode)
{
	using namespace EtcDecompressInternal;

	deUint8* const	dstPtr			= (deUint8*)dst.getDataPtr();
	const int		dstRowPitch		= dst.getRowPitch();
	const int		dstPixelSize	= ETC2_UNCOMPRESSED_PIXEL_SIZE_RG11;

	const deUint64	compressedBlockR = get128BitBlockStart(src, 0);
	const deUint64	compressedBlockG = get128BitBlockEnd(src, 0);
	deUint8			uncompressedBlockR[ETC2_UNCOMPRESSED_BLOCK_SIZE_R11];
	deUint8			uncompressedBlockG[ETC2_UNCOMPRESSED_BLOCK_SIZE_R11];

	// Decompress.
	decompressEAC11Block(uncompressedBlockR, compressedBlockR, signedMode);
	decompressEAC11Block(uncompressedBlockG, compressedBlockG, signedMode);

	// Write to dst.
	for (int y = 0; y < (int)ETC2_BLOCK_HEIGHT; y++)
	{
		for (int x = 0; x < (int)ETC2_BLOCK_WIDTH; x++)
		{
			DE_STATIC_ASSERT(ETC2_UNCOMPRESSED_PIXEL_SIZE_RG11 == 4);

			if (signedMode)
			{
				const deInt16* const	srcPixelR	= (deInt16*)&uncompressedBlockR[(y*ETC2_BLOCK_WIDTH + x)*ETC2_UNCOMPRESSED_PIXEL_SIZE_R11];
				const deInt16* const	srcPixelG	= (deInt16*)&uncompressedBlockG[(y*ETC2_BLOCK_WIDTH + x)*ETC2_UNCOMPRESSED_PIXEL_SIZE_R11];
				deInt16* const			dstPixel	= (deInt16*)(dstPtr + y*dstRowPitch + x*dstPixelSize);

				dstPixel[0] = extend11To16WithSign(srcPixelR[0]);
				dstPixel[1] = extend11To16WithSign(srcPixelG[0]);
			}
			else
			{
				const deUint16* const	srcPixelR	= (deUint16*)&uncompressedBlockR[(y*ETC2_BLOCK_WIDTH + x)*ETC2_UNCOMPRESSED_PIXEL_SIZE_R11];
				const deUint16* const	srcPixelG	= (deUint16*)&uncompressedBlockG[(y*ETC2_BLOCK_WIDTH + x)*ETC2_UNCOMPRESSED_PIXEL_SIZE_R11];
				deUint16* const			dstPixel	= (deUint16*)(dstPtr + y*dstRowPitch + x*dstPixelSize);

				dstPixel[0] = extend11To16(srcPixelR[0]);
				dstPixel[1] = extend11To16(srcPixelG[0]);
			}
		}
	}
}